

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O3

void __thiscall TTD::SnapshotExtractor::UnloadDataFromExtractor(SnapshotExtractor *this)

{
  MarkTable::Clear(&this->m_marks);
  DListBase<Js::RecyclableObject_*,_RealCount>::Clear<Memory::HeapAllocator>
            ((DListBase<Js::RecyclableObject_*,_RealCount> *)&this->m_worklist,
             (this->m_worklist).list.allocator);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Unload
            (&this->m_idToHandlerMap);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Unload(&this->m_idToTypeMap);
  this->m_pendingSnap = (SnapShot *)0x0;
  return;
}

Assistant:

void SnapshotExtractor::UnloadDataFromExtractor()
    {
        this->m_marks.Clear();
        this->m_worklist.Clear();

        this->m_idToHandlerMap.Unload();
        this->m_idToTypeMap.Unload();

        this->m_pendingSnap = nullptr;
    }